

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int resolveOrderGroupBy(NameContext *pNC,Select *pSelect,ExprList *pOrderBy,char *zType)

{
  Expr *pExpr;
  int iVar1;
  ExprList *pEVar2;
  ExprList_item *pEVar3;
  int iVar4;
  long lVar5;
  ExprList_item *pEVar6;
  Expr *p;
  long lVar7;
  int iCol;
  int local_5c;
  char *local_58;
  uint local_4c;
  Parse *local_48;
  NameContext *local_40;
  Expr *local_38;
  
  if (pOrderBy == (ExprList *)0x0) {
    return 0;
  }
  local_48 = pNC->pParse;
  local_58 = zType;
  local_40 = pNC;
  if (0 < pOrderBy->nExpr) {
    local_4c = pSelect->pEList->nExpr;
    pEVar3 = pOrderBy->a;
    iVar4 = 0;
    local_38 = (Expr *)pOrderBy;
    do {
      pExpr = pEVar3->pExpr;
      p = pExpr;
      while (p != (Expr *)0x0) {
        if ((p->flags >> 0xc & 1) == 0) goto LAB_002375de;
        if ((p->flags >> 0x12 & 1) == 0) {
          pEVar6 = (ExprList_item *)&p->pLeft;
        }
        else {
          pEVar6 = ((p->x).pList)->a;
        }
        p = pEVar6->pExpr;
      }
      p = (Expr *)0x0;
LAB_002375de:
      if ((*local_58 == 'G') ||
         (local_5c = resolveAsName((Parse *)pSelect->pEList,(ExprList *)p,local_38), local_5c < 1))
      {
        iVar1 = sqlite3ExprIsInteger(p,&local_5c);
        if (iVar1 != 0) {
          if (local_5c - 0x10000U < 0xffff0001) {
            sqlite3ErrorMsg(local_48,"%r %s BY term out of range - should be between 1 and %d",
                            (ulong)(iVar4 + 1),local_58,(ulong)local_4c);
            return 1;
          }
          goto LAB_00237621;
        }
        (pEVar3->u).x.iOrderByCol = 0;
        iVar1 = sqlite3ResolveExprNames(local_40,pExpr);
        if (iVar1 != 0) {
          return 1;
        }
        pEVar2 = pSelect->pEList;
        if (0 < pEVar2->nExpr) {
          lVar7 = 8;
          lVar5 = 0;
          do {
            iVar1 = sqlite3ExprCompare((Parse *)0x0,pExpr,*(Expr **)((long)pEVar2->a + lVar7 + -8),
                                       -1);
            if (iVar1 == 0) {
              (pEVar3->u).x.iOrderByCol = (short)lVar5 + 1;
            }
            lVar5 = lVar5 + 1;
            pEVar2 = pSelect->pEList;
            lVar7 = lVar7 + 0x20;
          } while (lVar5 < pEVar2->nExpr);
        }
      }
      else {
LAB_00237621:
        (pEVar3->u).x.iOrderByCol = (u16)local_5c;
      }
      iVar4 = iVar4 + 1;
      pEVar3 = pEVar3 + 1;
      iVar1._0_1_ = local_38->op;
      iVar1._1_1_ = local_38->affinity;
      iVar1._2_2_ = *(undefined2 *)&local_38->field_0x2;
      pOrderBy = (ExprList *)local_38;
    } while (iVar4 < iVar1);
  }
  iVar4 = sqlite3ResolveOrderGroupBy(local_48,pSelect,pOrderBy,local_58);
  return iVar4;
}

Assistant:

static int resolveOrderGroupBy(
  NameContext *pNC,     /* The name context of the SELECT statement */
  Select *pSelect,      /* The SELECT statement holding pOrderBy */
  ExprList *pOrderBy,   /* An ORDER BY or GROUP BY clause to resolve */
  const char *zType     /* Either "ORDER" or "GROUP", as appropriate */
){
  int i, j;                      /* Loop counters */
  int iCol;                      /* Column number */
  struct ExprList_item *pItem;   /* A term of the ORDER BY clause */
  Parse *pParse;                 /* Parsing context */
  int nResult;                   /* Number of terms in the result set */

  if( pOrderBy==0 ) return 0;
  nResult = pSelect->pEList->nExpr;
  pParse = pNC->pParse;
  for(i=0, pItem=pOrderBy->a; i<pOrderBy->nExpr; i++, pItem++){
    Expr *pE = pItem->pExpr;
    Expr *pE2 = sqlite3ExprSkipCollate(pE);
    if( zType[0]!='G' ){
      iCol = resolveAsName(pParse, pSelect->pEList, pE2);
      if( iCol>0 ){
        /* If an AS-name match is found, mark this ORDER BY column as being
        ** a copy of the iCol-th result-set column.  The subsequent call to
        ** sqlite3ResolveOrderGroupBy() will convert the expression to a
        ** copy of the iCol-th result-set expression. */
        pItem->u.x.iOrderByCol = (u16)iCol;
        continue;
      }
    }
    if( sqlite3ExprIsInteger(pE2, &iCol) ){
      /* The ORDER BY term is an integer constant.  Again, set the column
      ** number so that sqlite3ResolveOrderGroupBy() will convert the
      ** order-by term to a copy of the result-set expression */
      if( iCol<1 || iCol>0xffff ){
        resolveOutOfRangeError(pParse, zType, i+1, nResult);
        return 1;
      }
      pItem->u.x.iOrderByCol = (u16)iCol;
      continue;
    }

    /* Otherwise, treat the ORDER BY term as an ordinary expression */
    pItem->u.x.iOrderByCol = 0;
    if( sqlite3ResolveExprNames(pNC, pE) ){
      return 1;
    }
    for(j=0; j<pSelect->pEList->nExpr; j++){
      if( sqlite3ExprCompare(0, pE, pSelect->pEList->a[j].pExpr, -1)==0 ){
        pItem->u.x.iOrderByCol = j+1;
      }
    }
  }
  return sqlite3ResolveOrderGroupBy(pParse, pSelect, pOrderBy, zType);
}